

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

refs_t * refs_create(void)

{
  refs_t *r_00;
  string_alloc_t *psVar1;
  kh_refs_t *pkVar2;
  refs_t *r;
  
  r_00 = (refs_t *)calloc(1,0x70);
  if (r_00 != (refs_t *)0x0) {
    psVar1 = string_pool_create(0x2000);
    r_00->pool = psVar1;
    if (psVar1 != (string_alloc_t *)0x0) {
      r_00->ref_id = (ref_entry **)0x0;
      r_00->count = 1;
      r_00->last = (ref_entry *)0x0;
      r_00->last_id = -1;
      pkVar2 = kh_init_refs();
      r_00->h_meta = pkVar2;
      if (pkVar2 != (kh_refs_t *)0x0) {
        pthread_mutex_init((pthread_mutex_t *)&r_00->lock,(pthread_mutexattr_t *)0x0);
        return r_00;
      }
    }
    refs_free(r_00);
  }
  return (refs_t *)0x0;
}

Assistant:

static refs_t *refs_create(void) {
    refs_t *r = calloc(1, sizeof(*r));

    RP("refs_create()\n");

    if (!r)
	return NULL;

    if (!(r->pool = string_pool_create(8192)))
	goto err;

    r->ref_id = NULL; // see refs2id() to populate.
    r->count = 1;
    r->last = NULL;
    r->last_id = -1;

    if (!(r->h_meta = kh_init(refs)))
	goto err;

    pthread_mutex_init(&r->lock, NULL);

    return r;

 err:
    refs_free(r);
    return NULL;
}